

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O2

void __thiscall
axl::cry::AppStoreReceiptPayloadParser::AppStoreReceiptPayloadParser
          (AppStoreReceiptPayloadParser *this)

{
  this->m_receipt = (AppStoreReceipt *)0x0;
  this->m_iap = (AppStoreIap *)0x0;
  this->m_attributeId = AttributeId_Undefined;
  this->m_attributeString = (String *)0x0;
  this->m_attributeInteger = (void *)0x0;
  this->m_attributeIntegerSize = 0;
  return;
}

Assistant:

AppStoreReceiptPayloadParser::AppStoreReceiptPayloadParser() {
	m_receipt = NULL;
	m_iap = NULL;
	m_attributeId = AttributeId_Undefined;
	m_attributeString = NULL;
	m_attributeInteger = NULL;
	m_attributeIntegerSize = 0;
}